

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::SSLVersionTest::CreateContext(SSLVersionTest *this)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx_00;
  int iVar1;
  ParamType *pPVar2;
  SSL_METHOD *meth;
  SSL_CTX *ctx_01;
  UniquePtr<SSL_CTX> extraout_RAX;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_18;
  
  pPVar2 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar2->ssl_method == is_dtls) {
    meth = (SSL_METHOD *)DTLS_method();
  }
  else {
    meth = (SSL_METHOD *)TLS_method();
  }
  ctx_01 = (SSL_CTX *)SSL_CTX_new(meth);
  local_18._M_head_impl = ctx_01;
  if (ctx_01 != (SSL_CTX *)0x0) {
    pPVar2 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
    iVar1 = SSL_CTX_set_min_proto_version(ctx_01,pPVar2->version);
    ctx_00._M_head_impl = local_18._M_head_impl;
    if (iVar1 != 0) {
      pPVar2 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
      iVar1 = SSL_CTX_set_max_proto_version(ctx_00._M_head_impl,pPVar2->version);
      if (iVar1 != 0) {
        (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test
             = (_func_int **)local_18._M_head_impl;
        local_18._M_head_impl = (SSL_CTX *)0x0;
        goto LAB_00171f94;
      }
    }
  }
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test =
       (_func_int **)0x0;
LAB_00171f94:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_18);
  return (UniquePtr<SSL_CTX>)
         extraout_RAX._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
}

Assistant:

bssl::UniquePtr<SSL_CTX> CreateContext() const {
    const SSL_METHOD *method = is_dtls() ? DTLS_method() : TLS_method();
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
    if (!ctx || !SSL_CTX_set_min_proto_version(ctx.get(), version()) ||
        !SSL_CTX_set_max_proto_version(ctx.get(), version())) {
      return nullptr;
    }
    return ctx;
  }